

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_triangle_mesh.h
# Opt level: O3

PrimInfo * __thiscall
embree::avx::TriangleMeshISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,TriangleMeshISA *this,PrimRef *prims,BBox1f *time_range,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  BBox1f BVar2;
  BufferView<embree::Vec3fa> *pBVar3;
  char *pcVar4;
  size_t sVar5;
  undefined1 auVar6 [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  float fVar9;
  float fVar11;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  size_t *psVar18;
  undefined4 uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  int iVar24;
  uint uVar25;
  unsigned_long uVar26;
  ulong uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 extraout_var [56];
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  float fVar39;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar40;
  float fVar42;
  float fVar43;
  undefined1 auVar41 [16];
  float fVar44;
  undefined1 auVar45 [64];
  float fVar47;
  float fVar48;
  undefined1 auVar46 [16];
  float fVar49;
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  float fVar52;
  undefined1 auVar53 [64];
  float fVar54;
  undefined1 auVar55 [64];
  undefined1 auVar56 [16];
  float fVar62;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar57;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar58;
  float fVar60;
  float fVar61;
  undefined1 auVar59 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar63;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar64;
  undefined1 auVar65 [64];
  size_t local_b8;
  float fVar10;
  float fVar12;
  float fVar13;
  float fVar14;
  
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  __return_storage_ptr__->begin = SUB168(ZEXT816(0) << 0x20,0);
  __return_storage_ptr__->end = SUB168(ZEXT816(0) << 0x20,8);
  auVar45._0_8_ = Geometry::getTimeRange((Geometry *)this);
  auVar45._8_56_ = extraout_var;
  auVar29._8_8_ = 0;
  auVar29._0_4_ = time_range->lower;
  auVar29._4_4_ = time_range->upper;
  auVar28 = auVar45._0_16_;
  auVar31 = vcmpps_avx(auVar28,auVar29,1);
  auVar6 = vblendps_avx(auVar29,auVar28,2);
  auVar28 = vinsertps_avx(auVar28,auVar29,0x50);
  auVar6 = vblendvps_avx(auVar28,auVar6,auVar31);
  auVar31 = vmovshdup_avx(auVar6);
  fVar30 = auVar31._0_4_;
  if (auVar6._0_4_ <= fVar30) {
    uVar16 = r->_begin;
    uVar26 = r->_end;
    if (uVar16 < uVar26) {
      auVar31._8_4_ = 0xff800000;
      auVar31._0_8_ = 0xff800000ff800000;
      auVar31._12_4_ = 0xff800000;
      auVar45 = ZEXT1664(auVar31);
      auVar28._8_4_ = 0x7f800000;
      auVar28._0_8_ = 0x7f8000007f800000;
      auVar28._12_4_ = 0x7f800000;
      auVar50 = ZEXT1664(auVar28);
      local_b8 = 0;
      auVar51 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar53 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
      auVar55 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
      auVar59 = ZEXT1664(auVar28);
      auVar65 = ZEXT1664(auVar31);
      do {
        BVar2 = (this->super_TriangleMesh).super_Geometry.time_range;
        auVar37._8_8_ = 0;
        auVar37._0_4_ = BVar2.lower;
        auVar37._4_4_ = BVar2.upper;
        auVar31 = vmovshdup_avx(auVar37);
        fVar36 = BVar2.lower;
        fVar54 = auVar6._0_4_ - fVar36;
        fVar39 = auVar31._0_4_ - fVar36;
        lVar17 = *(long *)&(this->super_TriangleMesh).super_Geometry.field_0x58;
        lVar22 = *(long *)&(this->super_TriangleMesh).field_0x68 * uVar16;
        uVar20 = (ulong)*(uint *)(lVar17 + lVar22);
        pBVar3 = (this->super_TriangleMesh).vertices.items;
        uVar27 = (pBVar3->super_RawBufferView).num;
        if (((uVar20 < uVar27) && (uVar21 = (ulong)*(uint *)(lVar17 + 4 + lVar22), uVar21 < uVar27))
           && (uVar23 = (ulong)*(uint *)(lVar17 + 8 + lVar22), uVar23 < uVar27)) {
          fVar1 = (this->super_TriangleMesh).super_Geometry.fnumTimeSegments;
          auVar28 = ZEXT416((uint)(fVar1 * (fVar54 / fVar39) * 1.0000002));
          auVar28 = vroundss_avx(auVar28,auVar28,9);
          auVar37 = auVar51._0_16_;
          auVar28 = vmaxss_avx(auVar37,auVar28);
          auVar29 = ZEXT416((uint)(fVar1 * ((fVar30 - fVar36) / fVar39) * 0.99999976));
          auVar29 = vroundss_avx(auVar29,auVar29,10);
          auVar29 = vminss_avx(auVar29,ZEXT416((uint)fVar1));
          if ((uint)(int)auVar28._0_4_ <= (uint)(int)auVar29._0_4_) {
            uVar27 = (ulong)(int)auVar28._0_4_;
            psVar18 = &pBVar3[uVar27].super_RawBufferView.stride;
            do {
              pcVar4 = ((RawBufferView *)(psVar18 + -2))->ptr_ofs;
              sVar5 = *psVar18;
              auVar41 = auVar53._0_16_;
              auVar28 = vcmpps_avx(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar20),auVar41,6);
              auVar38 = auVar55._0_16_;
              auVar46 = vcmpps_avx(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar20),auVar38,1);
              auVar28 = vandps_avx(auVar28,auVar46);
              uVar19 = vmovmskps_avx(auVar28);
              if ((~(byte)uVar19 & 7) != 0) goto LAB_011f8fb2;
              auVar28 = vcmpps_avx(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar21),auVar41,6);
              auVar46 = vcmpps_avx(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar21),auVar38,1);
              auVar28 = vandps_avx(auVar28,auVar46);
              uVar19 = vmovmskps_avx(auVar28);
              if ((~(byte)uVar19 & 7) != 0) goto LAB_011f8fb2;
              auVar28 = vcmpps_avx(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar23),auVar41,6);
              auVar46 = vcmpps_avx(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar23),auVar38,1);
              auVar28 = vandps_avx(auVar28,auVar46);
              uVar19 = vmovmskps_avx(auVar28);
              if ((~(byte)uVar19 & 7) != 0) goto LAB_011f8fb2;
              uVar27 = uVar27 + 1;
              psVar18 = psVar18 + 7;
            } while (uVar27 <= (ulong)(long)(int)auVar29._0_4_);
          }
          fVar52 = auVar31._0_4_ - fVar36;
          fVar54 = fVar54 / fVar52;
          fVar52 = (fVar30 - fVar36) / fVar52;
          fVar39 = fVar1 * fVar54;
          fVar36 = fVar1 * fVar52;
          auVar29 = vroundss_avx(ZEXT416((uint)fVar39),ZEXT416((uint)fVar39),9);
          auVar46 = vroundss_avx(ZEXT416((uint)fVar36),ZEXT416((uint)fVar36),10);
          auVar31 = vmaxss_avx(auVar29,auVar37);
          auVar28 = vminss_avx(auVar46,ZEXT416((uint)fVar1));
          fVar40 = auVar28._0_4_;
          iVar24 = (int)auVar29._0_4_;
          if (iVar24 < 0) {
            iVar24 = -1;
          }
          uVar15 = (int)fVar1 + 1U;
          if ((int)auVar46._0_4_ < (int)((int)fVar1 + 1U)) {
            uVar15 = (int)auVar46._0_4_;
          }
          lVar17 = (long)(int)auVar31._0_4_;
          pcVar4 = pBVar3[lVar17].super_RawBufferView.ptr_ofs;
          sVar5 = pBVar3[lVar17].super_RawBufferView.stride;
          auVar28 = vminps_avx(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar20),
                               *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar21));
          auVar46 = vminps_avx(auVar28,*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar23));
          auVar28 = vmaxps_avx(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar20),
                               *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar21));
          auVar28 = vmaxps_avx(auVar28,*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar23));
          lVar22 = (long)(int)fVar40;
          pcVar4 = pBVar3[lVar22].super_RawBufferView.ptr_ofs;
          sVar5 = pBVar3[lVar22].super_RawBufferView.stride;
          auVar29 = vminps_avx(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar20),
                               *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar21));
          auVar41 = vminps_avx(auVar29,*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar23));
          auVar29 = vmaxps_avx(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar20),
                               *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar21));
          auVar29 = vmaxps_avx(auVar29,*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar23));
          auVar31 = ZEXT416((uint)(fVar39 - auVar31._0_4_));
          fVar47 = auVar41._4_4_;
          fVar9 = auVar41._8_4_;
          fVar11 = auVar41._12_4_;
          fVar48 = auVar46._4_4_;
          fVar10 = auVar46._8_4_;
          fVar12 = auVar46._12_4_;
          fVar49 = auVar29._4_4_;
          fVar61 = auVar29._8_4_;
          fVar13 = auVar29._12_4_;
          fVar60 = auVar28._4_4_;
          fVar62 = auVar28._8_4_;
          fVar14 = auVar28._12_4_;
          fVar39 = auVar46._0_4_;
          fVar42 = auVar28._0_4_;
          fVar43 = auVar41._0_4_;
          fVar44 = auVar29._0_4_;
          if (uVar15 - iVar24 == 1) {
            auVar31 = vmaxss_avx(auVar31,auVar37);
            auVar28 = vshufps_avx(auVar31,auVar31,0);
            auVar31 = ZEXT416((uint)(1.0 - auVar31._0_4_));
            auVar31 = vshufps_avx(auVar31,auVar31,0);
            auVar56._0_4_ = auVar31._0_4_ * fVar39 + auVar28._0_4_ * fVar43;
            auVar56._4_4_ = auVar31._4_4_ * fVar48 + auVar28._4_4_ * fVar47;
            auVar56._8_4_ = auVar31._8_4_ * fVar10 + auVar28._8_4_ * fVar9;
            auVar56._12_4_ = auVar31._12_4_ * fVar12 + auVar28._12_4_ * fVar11;
            auVar38._0_4_ = auVar31._0_4_ * fVar42 + auVar28._0_4_ * fVar44;
            auVar38._4_4_ = auVar31._4_4_ * fVar60 + auVar28._4_4_ * fVar49;
            auVar38._8_4_ = auVar31._8_4_ * fVar62 + auVar28._8_4_ * fVar61;
            auVar38._12_4_ = auVar31._12_4_ * fVar14 + auVar28._12_4_ * fVar13;
            auVar31 = vmaxss_avx(ZEXT416((uint)(fVar40 - fVar36)),auVar37);
            auVar28 = vshufps_avx(auVar31,auVar31,0);
            auVar31 = ZEXT416((uint)(1.0 - auVar31._0_4_));
            auVar31 = vshufps_avx(auVar31,auVar31,0);
            auVar41._0_4_ = auVar28._0_4_ * fVar39 + auVar31._0_4_ * fVar43;
            auVar41._4_4_ = auVar28._4_4_ * fVar48 + auVar31._4_4_ * fVar47;
            auVar41._8_4_ = auVar28._8_4_ * fVar10 + auVar31._8_4_ * fVar9;
            auVar41._12_4_ = auVar28._12_4_ * fVar12 + auVar31._12_4_ * fVar11;
            auVar46._0_4_ = auVar28._0_4_ * fVar42 + auVar31._0_4_ * fVar44;
            auVar46._4_4_ = auVar28._4_4_ * fVar60 + auVar31._4_4_ * fVar49;
            auVar46._8_4_ = auVar28._8_4_ * fVar62 + auVar31._8_4_ * fVar61;
            auVar46._12_4_ = auVar28._12_4_ * fVar14 + auVar31._12_4_ * fVar13;
          }
          else {
            pcVar4 = pBVar3[lVar17 + 1].super_RawBufferView.ptr_ofs;
            sVar5 = pBVar3[lVar17 + 1].super_RawBufferView.stride;
            auVar28 = vminps_avx(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar20),
                                 *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar21));
            auVar37 = vminps_avx(auVar28,*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar23));
            auVar28 = vmaxps_avx(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar20),
                                 *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar21));
            auVar28 = vmaxps_avx(auVar28,*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar23));
            pcVar4 = pBVar3[lVar22 + -1].super_RawBufferView.ptr_ofs;
            sVar5 = pBVar3[lVar22 + -1].super_RawBufferView.stride;
            auVar29 = vminps_avx(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar20),
                                 *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar21));
            auVar46 = vminps_avx(auVar29,*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar23));
            auVar29 = vmaxps_avx(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar20),
                                 *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar21));
            auVar29 = vmaxps_avx(auVar29,*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar23));
            auVar31 = vmaxss_avx(auVar31,ZEXT816(0) << 0x20);
            auVar41 = vshufps_avx(auVar31,auVar31,0);
            auVar31 = ZEXT416((uint)(1.0 - auVar31._0_4_));
            auVar31 = vshufps_avx(auVar31,auVar31,0);
            auVar56._0_4_ = auVar37._0_4_ * auVar41._0_4_ + auVar31._0_4_ * fVar39;
            auVar56._4_4_ = auVar37._4_4_ * auVar41._4_4_ + auVar31._4_4_ * fVar48;
            auVar56._8_4_ = auVar37._8_4_ * auVar41._8_4_ + auVar31._8_4_ * fVar10;
            auVar56._12_4_ = auVar37._12_4_ * auVar41._12_4_ + auVar31._12_4_ * fVar12;
            auVar38._0_4_ = auVar31._0_4_ * fVar42 + auVar41._0_4_ * auVar28._0_4_;
            auVar38._4_4_ = auVar31._4_4_ * fVar60 + auVar41._4_4_ * auVar28._4_4_;
            auVar38._8_4_ = auVar31._8_4_ * fVar62 + auVar41._8_4_ * auVar28._8_4_;
            auVar38._12_4_ = auVar31._12_4_ * fVar14 + auVar41._12_4_ * auVar28._12_4_;
            auVar31 = vmaxss_avx(ZEXT416((uint)(fVar40 - fVar36)),ZEXT416(0));
            auVar28 = vshufps_avx(auVar31,auVar31,0);
            auVar31 = ZEXT416((uint)(1.0 - auVar31._0_4_));
            auVar31 = vshufps_avx(auVar31,auVar31,0);
            auVar41._0_4_ = auVar31._0_4_ * fVar43 + auVar46._0_4_ * auVar28._0_4_;
            auVar41._4_4_ = auVar31._4_4_ * fVar47 + auVar46._4_4_ * auVar28._4_4_;
            auVar41._8_4_ = auVar31._8_4_ * fVar9 + auVar46._8_4_ * auVar28._8_4_;
            auVar41._12_4_ = auVar31._12_4_ * fVar11 + auVar46._12_4_ * auVar28._12_4_;
            auVar46._0_4_ = auVar31._0_4_ * fVar44 + auVar29._0_4_ * auVar28._0_4_;
            auVar46._4_4_ = auVar31._4_4_ * fVar49 + auVar29._4_4_ * auVar28._4_4_;
            auVar46._8_4_ = auVar31._8_4_ * fVar61 + auVar29._8_4_ * auVar28._8_4_;
            auVar46._12_4_ = auVar31._12_4_ * fVar13 + auVar29._12_4_ * auVar28._12_4_;
            uVar25 = iVar24 + 1;
            if ((int)uVar25 < (int)uVar15) {
              psVar18 = &pBVar3[uVar25].super_RawBufferView.stride;
              do {
                auVar32._0_4_ = ((float)(int)uVar25 / fVar1 - fVar54) / (fVar52 - fVar54);
                auVar32._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar31 = vshufps_avx(auVar32,auVar32,0);
                fVar42 = auVar41._4_4_;
                fVar43 = auVar41._8_4_;
                fVar44 = auVar41._12_4_;
                auVar28 = vshufps_avx(ZEXT416((uint)(1.0 - auVar32._0_4_)),
                                      ZEXT416((uint)(1.0 - auVar32._0_4_)),0);
                fVar60 = auVar56._4_4_;
                fVar61 = auVar56._8_4_;
                fVar62 = auVar56._12_4_;
                auVar35._0_4_ = auVar41._0_4_ * auVar31._0_4_ + auVar56._0_4_ * auVar28._0_4_;
                auVar35._4_4_ = fVar42 * auVar31._4_4_ + fVar60 * auVar28._4_4_;
                auVar35._8_4_ = fVar43 * auVar31._8_4_ + fVar61 * auVar28._8_4_;
                auVar35._12_4_ = fVar44 * auVar31._12_4_ + fVar62 * auVar28._12_4_;
                fVar47 = auVar46._4_4_;
                fVar48 = auVar46._8_4_;
                fVar49 = auVar46._12_4_;
                fVar39 = auVar38._4_4_;
                fVar36 = auVar38._8_4_;
                fVar40 = auVar38._12_4_;
                auVar33._0_4_ = auVar46._0_4_ * auVar31._0_4_ + auVar38._0_4_ * auVar28._0_4_;
                auVar33._4_4_ = fVar47 * auVar31._4_4_ + fVar39 * auVar28._4_4_;
                auVar33._8_4_ = fVar48 * auVar31._8_4_ + fVar36 * auVar28._8_4_;
                auVar33._12_4_ = fVar49 * auVar31._12_4_ + fVar40 * auVar28._12_4_;
                pcVar4 = ((RawBufferView *)(psVar18 + -2))->ptr_ofs;
                sVar5 = *psVar18;
                auVar31 = vminps_avx(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar20),
                                     *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar21));
                auVar31 = vminps_avx(auVar31,*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar23));
                auVar28 = vsubps_avx(auVar31,auVar35);
                auVar31 = vmaxps_avx(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar20),
                                     *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar21));
                auVar31 = vmaxps_avx(auVar31,*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar23));
                auVar31 = vsubps_avx(auVar31,auVar33);
                auVar28 = vminps_avx(auVar28,ZEXT816(0) << 0x20);
                auVar31 = vmaxps_avx(auVar31,ZEXT816(0) << 0x20);
                auVar56._0_4_ = auVar56._0_4_ + auVar28._0_4_;
                auVar56._4_4_ = fVar60 + auVar28._4_4_;
                auVar56._8_4_ = fVar61 + auVar28._8_4_;
                auVar56._12_4_ = fVar62 + auVar28._12_4_;
                auVar41._0_4_ = auVar41._0_4_ + auVar28._0_4_;
                auVar41._4_4_ = fVar42 + auVar28._4_4_;
                auVar41._8_4_ = fVar43 + auVar28._8_4_;
                auVar41._12_4_ = fVar44 + auVar28._12_4_;
                auVar38._0_4_ = auVar38._0_4_ + auVar31._0_4_;
                auVar38._4_4_ = fVar39 + auVar31._4_4_;
                auVar38._8_4_ = fVar36 + auVar31._8_4_;
                auVar38._12_4_ = fVar40 + auVar31._12_4_;
                auVar46._0_4_ = auVar46._0_4_ + auVar31._0_4_;
                auVar46._4_4_ = fVar47 + auVar31._4_4_;
                auVar46._8_4_ = fVar48 + auVar31._8_4_;
                auVar46._12_4_ = fVar49 + auVar31._12_4_;
                uVar25 = uVar25 + 1;
                psVar18 = psVar18 + 7;
              } while (uVar15 != uVar25);
            }
          }
          auVar31 = vmaxps_avx(auVar38,auVar46);
          auVar28 = vminps_avx(auVar56,auVar41);
          aVar7 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                  vinsertps_avx(auVar28,ZEXT416(geomID),0x30);
          aVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                  vinsertps_avx(auVar31,ZEXT416((uint)uVar16),0x30);
          auVar31 = vminps_avx(auVar50._0_16_,(undefined1  [16])aVar7);
          auVar50 = ZEXT1664(auVar31);
          auVar31 = vmaxps_avx(auVar45._0_16_,(undefined1  [16])aVar8);
          auVar45 = ZEXT1664(auVar31);
          auVar34._0_4_ = aVar7.x + aVar8.x;
          auVar34._4_4_ = aVar7.y + aVar8.y;
          auVar34._8_4_ = aVar7.z + aVar8.z;
          auVar34._12_4_ = aVar7.field_3.w + aVar8.field_3.w;
          auVar31 = vminps_avx(auVar59._0_16_,auVar34);
          auVar59 = ZEXT1664(auVar31);
          auVar31 = vmaxps_avx(auVar65._0_16_,auVar34);
          auVar65 = ZEXT1664(auVar31);
          local_b8 = local_b8 + 1;
          prims[k].lower.field_0.field_1 = aVar7;
          prims[k].upper.field_0.field_1 = aVar8;
          uVar26 = r->_end;
          auVar51 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar53 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
          auVar55 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
          k = k + 1;
        }
LAB_011f8fb2:
        aVar63 = auVar65._0_16_;
        aVar57 = auVar59._0_16_;
        aVar64 = auVar45._0_16_;
        aVar58 = auVar50._0_16_;
        uVar16 = uVar16 + 1;
      } while (uVar16 < uVar26);
    }
    else {
      local_b8 = 0;
      aVar64.m128[2] = -INFINITY;
      aVar64._0_8_ = 0xff800000ff800000;
      aVar64.m128[3] = -INFINITY;
      aVar58.m128[2] = INFINITY;
      aVar58._0_8_ = 0x7f8000007f800000;
      aVar58.m128[3] = INFINITY;
      aVar57 = aVar58;
      aVar63 = aVar64;
    }
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
         = aVar58;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
         = aVar64;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
         = aVar57;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
         = aVar63;
    __return_storage_ptr__->end = local_b8;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(getTimeRange(), time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j = r.begin(); j < r.end(); j++) {
          LBBox3fa lbounds = empty;
          if (!linearBounds(j, t0t1, lbounds))
            continue;
          const PrimRef prim(lbounds.bounds(), geomID, unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }